

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_seed_tests.cpp
# Opt level: O2

void __thiscall iu_Foo_x_iutest_x_Bar_Test::Body(iu_Foo_x_iutest_x_Bar_Test *this)

{
  uint *in_R9;
  AssertionResult iutest_ar;
  iuCodeMessage local_1c0;
  Fixed local_190;
  
  if (seed == 0) {
    iutest::UnitTest::instance();
    local_190.super_Message.m_stream.super_iu_stringstream._0_4_ =
         iutest::TestEnv::current_random_seed();
    iutest::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              (&iutest_ar,(internal *)"kSeed","::iutest::UnitTest::GetInstance()->random_seed()",
               (char *)&kSeed,(uint *)&local_190,in_R9);
    if (iutest_ar.m_result != false) goto LAB_00119942;
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/random_seed_tests.cpp"
               ,0x24,iutest_ar.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
  }
  else {
    iutest::UnitTest::instance();
    local_190.super_Message.m_stream.super_iu_stringstream._0_4_ =
         iutest::TestEnv::current_random_seed();
    iutest::internal::CmpHelperNE<unsigned_int,unsigned_int>
              (&iutest_ar,(internal *)0x1285e2,"::iutest::UnitTest::GetInstance()->random_seed()",
               (char *)&seed,(uint *)&local_190,in_R9);
    if (iutest_ar.m_result != false) goto LAB_00119942;
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/random_seed_tests.cpp"
               ,0x28,iutest_ar.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
  }
  std::__cxx11::string::~string((string *)&local_1c0);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_190);
LAB_00119942:
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST(Foo, Bar)
{
    if( seed == 0 )
    {
        IUTEST_ASSERT_EQ(kSeed, ::iutest::UnitTest::GetInstance()->random_seed());
    }
    else
    {
        IUTEST_ASSERT_NE(seed, ::iutest::UnitTest::GetInstance()->random_seed());
    }
}